

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_handle.cpp
# Opt level: O1

void CATCH2_INTERNAL_TEST_2(void)

{
  StringRef message;
  StringRef message_00;
  StringRef macroName;
  StringRef macroName_00;
  AssertionHandler catchAssertionHandler;
  ReusableStringStream local_88;
  string local_78;
  AssertionHandler local_58;
  
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/unique_handle.cpp"
  ;
  local_78._M_string_length = 0x3b;
  macroName.m_size = 7;
  macroName.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46e3a7),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,"!std::copy_constructible<test_handle>",0x25);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message.m_size = local_78._M_string_length;
  message.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/unique_handle.cpp"
  ;
  local_78._M_string_length = 0x3c;
  macroName_00.m_size = 7;
  macroName_00.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName_00,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46e3a7),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,"!std::assignable_from<test_handle&, const test_handle&>",0x37);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message_00.m_size = local_78._M_string_length;
  message_00.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

constexpr value_t(int a)
			: a{ a }
		{ }